

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

bool __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::has_element(raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *this,value_type *elem,size_t hashval)

{
  char *pcVar1;
  Enum EVar2;
  ctrl_t *pcVar3;
  ulong uVar4;
  slot_type *psVar5;
  size_t sVar6;
  pointer __s2;
  size_t __n;
  uint uVar7;
  ushort uVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  int iVar25;
  uint uVar26;
  ulong uVar27;
  byte unaff_BPL;
  ulong uVar28;
  bool bVar29;
  bool bVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  __m128i match;
  ulong local_78;
  char local_58;
  char cStack_57;
  char cStack_56;
  char cStack_55;
  
  pcVar3 = this->ctrl_;
  if (pcVar3 == (ctrl_t *)0x0) {
    unaff_BPL = 0;
  }
  else {
    uVar4 = this->capacity_;
    if ((uVar4 + 1 & uVar4) != 0) {
      __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                    ,0x95,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
    }
    uVar28 = hashval >> 7 & uVar4;
    auVar31 = ZEXT216(CONCAT11((char)hashval,(char)hashval) & 0x7f7f);
    auVar31 = pshuflw(auVar31,auVar31,0);
    psVar5 = this->slots_;
    EVar2 = elem->first;
    sVar6 = (elem->second)._M_string_length;
    __s2 = (elem->second)._M_dataplus._M_p;
    local_78 = 0;
    do {
      pcVar1 = pcVar3 + uVar28;
      cVar9 = *pcVar1;
      cVar10 = pcVar1[1];
      cVar11 = pcVar1[2];
      cVar12 = pcVar1[3];
      cVar13 = pcVar1[4];
      cVar14 = pcVar1[5];
      cVar15 = pcVar1[6];
      cVar16 = pcVar1[7];
      cVar17 = pcVar1[8];
      cVar18 = pcVar1[9];
      cVar19 = pcVar1[10];
      cVar20 = pcVar1[0xb];
      cVar21 = pcVar1[0xc];
      cVar22 = pcVar1[0xd];
      cVar23 = pcVar1[0xe];
      cVar24 = pcVar1[0xf];
      local_58 = auVar31[0];
      cStack_57 = auVar31[1];
      cStack_56 = auVar31[2];
      cStack_55 = auVar31[3];
      auVar32[0] = -(local_58 == cVar9);
      auVar32[1] = -(cStack_57 == cVar10);
      auVar32[2] = -(cStack_56 == cVar11);
      auVar32[3] = -(cStack_55 == cVar12);
      auVar32[4] = -(local_58 == cVar13);
      auVar32[5] = -(cStack_57 == cVar14);
      auVar32[6] = -(cStack_56 == cVar15);
      auVar32[7] = -(cStack_55 == cVar16);
      auVar32[8] = -(local_58 == cVar17);
      auVar32[9] = -(cStack_57 == cVar18);
      auVar32[10] = -(cStack_56 == cVar19);
      auVar32[0xb] = -(cStack_55 == cVar20);
      auVar32[0xc] = -(local_58 == cVar21);
      auVar32[0xd] = -(cStack_57 == cVar22);
      auVar32[0xe] = -(cStack_56 == cVar23);
      auVar32[0xf] = -(cStack_55 == cVar24);
      uVar8 = (ushort)(SUB161(auVar32 >> 7,0) & 1) | (ushort)(SUB161(auVar32 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar32 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar32 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar32 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar32 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar32 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar32 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar32 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar32 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar32 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar32 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar32 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar32 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar32 >> 0x77,0) & 1) << 0xe | (ushort)(auVar32[0xf] >> 7) << 0xf;
      bVar29 = uVar8 == 0;
      if (!bVar29) {
        uVar26 = (uint)uVar8;
        do {
          uVar7 = 0;
          if (uVar26 != 0) {
            for (; (uVar26 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
            }
          }
          uVar27 = uVar7 + uVar28 & uVar4;
          if (psVar5[uVar27].value.first == EVar2) {
            __n = (&psVar5->value)[uVar27].second._M_string_length;
            if (__n != sVar6) goto LAB_00193d19;
            if (__n == 0) {
              bVar30 = true;
            }
            else {
              iVar25 = bcmp((&psVar5->value)[uVar27].second._M_dataplus._M_p,__s2,__n);
              bVar30 = iVar25 == 0;
            }
          }
          else {
LAB_00193d19:
            bVar30 = false;
          }
          unaff_BPL = unaff_BPL | bVar30;
          if (bVar30 != false) break;
          uVar26 = uVar26 - 1 & uVar26;
          bVar29 = uVar26 == 0;
        } while (!bVar29);
      }
      if (bVar29) {
        auVar33[0] = -(cVar9 == -0x80);
        auVar33[1] = -(cVar10 == -0x80);
        auVar33[2] = -(cVar11 == -0x80);
        auVar33[3] = -(cVar12 == -0x80);
        auVar33[4] = -(cVar13 == -0x80);
        auVar33[5] = -(cVar14 == -0x80);
        auVar33[6] = -(cVar15 == -0x80);
        auVar33[7] = -(cVar16 == -0x80);
        auVar33[8] = -(cVar17 == -0x80);
        auVar33[9] = -(cVar18 == -0x80);
        auVar33[10] = -(cVar19 == -0x80);
        auVar33[0xb] = -(cVar20 == -0x80);
        auVar33[0xc] = -(cVar21 == -0x80);
        auVar33[0xd] = -(cVar22 == -0x80);
        auVar33[0xe] = -(cVar23 == -0x80);
        auVar33[0xf] = -(cVar24 == -0x80);
        if ((((((((((((((((auVar33 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                         (auVar33 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar33 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar33 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar33 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar33 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar33 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar33 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar33 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar33 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar33 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar33 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar33 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar33 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar33 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar33[0xf]
           ) {
          if (uVar4 <= local_78 + 0x10) {
            __assert_fail("seq.getindex() < capacity_ && \"full table!\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                          ,0x87c,
                          "bool phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::Enum, std::basic_string<char>>, phmap::priv::StatefulTestingHash, phmap::priv::StatefulTestingEqual, phmap::priv::Alloc<std::pair<const phmap::priv::hash_internal::Enum, std::basic_string<char>>>>::has_element(const value_type &__restrict, size_t) const [Policy = phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::Enum, std::basic_string<char>>, Hash = phmap::priv::StatefulTestingHash, Eq = phmap::priv::StatefulTestingEqual, Alloc = phmap::priv::Alloc<std::pair<const phmap::priv::hash_internal::Enum, std::basic_string<char>>>]"
                         );
          }
          uVar28 = uVar28 + local_78 + 0x10 & uVar4;
          bVar29 = true;
          local_78 = local_78 + 0x10;
        }
        else {
          bVar29 = false;
          unaff_BPL = 0;
        }
      }
      else {
        bVar29 = false;
      }
    } while (bVar29);
  }
  return (bool)(unaff_BPL & 1);
}

Assistant:

bool has_element(const value_type& PHMAP_RESTRICT elem, size_t hashval) const {
        PHMAP_IF_CONSTEXPR (!std_alloc_t::value) {
            // ctrl_ could be nullptr
            if (!ctrl_)
                return false;
        }
        auto seq = probe(hashval);
        while (true) {
            Group g{ctrl_ + seq.offset()};
            for (uint32_t i : g.Match((h2_t)H2(hashval))) {
                if (PHMAP_PREDICT_TRUE(PolicyTraits::element(slots_ + seq.offset((size_t)i)) ==
                                      elem))
                    return true;
            }
            if (PHMAP_PREDICT_TRUE(g.MatchEmpty())) return false;
            seq.next();
            assert(seq.getindex() < capacity_ && "full table!");
        }
        return false;
    }